

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

bool * __thiscall cxxopts::OptionValue::as<bool>(OptionValue *this)

{
  long lVar1;
  bool *pbVar2;
  element_type *peVar3;
  string local_40;
  allocator<char> local_19;
  
  peVar3 = (this->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 == (element_type *)0x0) {
    if (this->m_long_name == (string *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_19);
    }
    else {
      std::__cxx11::string::string((string *)&local_40,(string *)this->m_long_name);
    }
    throw_or_mimic<cxxopts::option_has_no_value_exception>(&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    peVar3 = (this->m_value).super___shared_ptr<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  lVar1 = __dynamic_cast(peVar3,&Value::typeinfo,&values::standard_value<bool>::typeinfo,0);
  if (lVar1 != 0) {
    pbVar2 = *(bool **)(lVar1 + 0x28);
    if (pbVar2 == (bool *)0x0) {
      pbVar2 = *(bool **)(lVar1 + 0x18);
    }
    return pbVar2;
  }
  __cxa_bad_cast();
}

Assistant:

const T&
    as() const
    {
      if (m_value == nullptr) {
          throw_or_mimic<option_has_no_value_exception>(
              m_long_name == nullptr ? "" : *m_long_name);
      }

#ifdef CXXOPTS_NO_RTTI
      return static_cast<const values::standard_value<T>&>(*m_value).get();
#else
      return dynamic_cast<const values::standard_value<T>&>(*m_value).get();
#endif
    }